

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

void * calloc(size_t __nmemb,size_t __size)

{
  void *__s;
  size_t local_28;
  size_t req;
  void *mem;
  size_t elem_size_local;
  size_t n_elements_local;
  
  local_28 = 0;
  if (((__nmemb != 0) &&
      (local_28 = __nmemb * __size, ((__nmemb | __size) & 0xffffffffffff0000) != 0)) &&
     (local_28 / __nmemb != __size)) {
    local_28 = 0xffffffffffffffff;
  }
  __s = malloc(local_28);
  if ((__s != (void *)0x0) && ((*(ulong *)((long)__s + -8) & 3) != 0)) {
    memset(__s,0,local_28);
  }
  return __s;
}

Assistant:

void* dlcalloc(size_t n_elements, size_t elem_size) {
  void* mem;
  size_t req = 0;
  if (n_elements != 0) {
    req = n_elements * elem_size;
    if (((n_elements | elem_size) & ~(size_t)0xffff) &&
        (req / n_elements != elem_size))
      req = MAX_SIZE_T; /* force downstream failure on overflow */
  }
  mem = dlmalloc(req);
  if (mem != 0 && calloc_must_clear(mem2chunk(mem)))
    memset(mem, 0, req);
  return mem;
}